

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::ProfiledNewScIntArray
              (AuxArray<int> *ints,ScriptContext *scriptContext,ArrayCallSiteInfo *arrayInfo,
              RecyclerWeakReference<Js::FunctionBody> *weakFuncRef)

{
  uint length;
  uint32 nValue;
  code *pcVar1;
  bool bVar2;
  ThreadContext *threadContext;
  FunctionBody *functionBody_00;
  CacheForCopyOnAccessArraySegments **ppCVar3;
  SparseArraySegment<int> *pSVar4;
  SparseArraySegment<double> *pSVar5;
  JavascriptLibrary *pJVar6;
  SparseArraySegmentBase **ppSVar7;
  SparseArraySegment<void_*> *pSVar8;
  undefined4 *puVar9;
  uint local_d4;
  uint i_1;
  SparseArraySegment<void_*> *head;
  JavascriptArray *arr;
  uint i;
  SparseArraySegment<double> *head_2;
  JavascriptNativeFloatArray *arr_2;
  SparseArraySegment<int> *head_1;
  FunctionBody *functionBody;
  JavascriptLibrary *lib;
  JavascriptNativeIntArray *arr_1;
  undefined1 local_68 [4];
  uint32 count;
  JsReentLock reentrancylock;
  RecyclerWeakReference<Js::FunctionBody> *weakFuncRef_local;
  ArrayCallSiteInfo *arrayInfo_local;
  ScriptContext *scriptContext_local;
  AuxArray<int> *ints_local;
  void *local_10;
  
  reentrancylock._24_8_ = weakFuncRef;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_68,threadContext);
  length = ints->count;
  bVar2 = ArrayCallSiteInfo::IsNativeIntArray(arrayInfo);
  if (bVar2) {
    pJVar6 = ScriptContext::GetLibrary(scriptContext);
    functionBody_00 =
         Memory::RecyclerWeakReference<Js::FunctionBody>::Get
                   ((RecyclerWeakReference<Js::FunctionBody> *)reentrancylock._24_8_);
    bVar2 = JavascriptLibrary::IsCopyOnAccessArrayCallSite(pJVar6,arrayInfo,length);
    if (bVar2) {
      ppCVar3 = Memory::WriteBarrierPtr::operator_cast_to_CacheForCopyOnAccessArraySegments__
                          ((WriteBarrierPtr *)&pJVar6->cacheForCopyOnAccessArraySegments);
      if (*ppCVar3 == (CacheForCopyOnAccessArraySegments *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x3ee,"(lib->cacheForCopyOnAccessArraySegments)",
                                    "lib->cacheForCopyOnAccessArraySegments");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      pJVar6 = ScriptContext::GetLibrary(scriptContext);
      lib = (JavascriptLibrary *)
            JavascriptLibrary::CreateCopyOnAccessNativeIntArrayLiteral
                      (pJVar6,arrayInfo,functionBody_00,ints);
    }
    else {
      pJVar6 = ScriptContext::GetLibrary(scriptContext);
      lib = (JavascriptLibrary *)JavascriptLibrary::CreateNativeIntArrayLiteral(pJVar6,length);
      ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                          ((WriteBarrierPtr *)&(lib->super_JavascriptLibraryBase).weakSetConstructor
                          );
      pSVar4 = SparseArraySegment<int>::From(*ppSVar7);
      if ((length == 0) || (length != (pSVar4->super_SparseArraySegmentBase).length)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x3f6,"(count > 0 && count == head->length)",
                                    "count > 0 && count == head->length");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      Memory::CopyArray<int,int,Memory::Recycler>
                ((int *)(pSVar4 + 1),(ulong)(pSVar4->super_SparseArraySegmentBase).length,
                 (int *)(ints + 1),(ulong)length);
    }
    JavascriptNativeArray::SetArrayProfileInfo
              ((JavascriptNativeArray *)lib,
               (RecyclerWeakReference<Js::FunctionBody> *)reentrancylock._24_8_,arrayInfo);
    ints_local = (AuxArray<int> *)lib;
  }
  else {
    bVar2 = ArrayCallSiteInfo::IsNativeFloatArray(arrayInfo);
    if (bVar2) {
      pJVar6 = ScriptContext::GetLibrary(scriptContext);
      ints_local = (AuxArray<int> *)JavascriptLibrary::CreateNativeFloatArrayLiteral(pJVar6,length);
      ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                          ((WriteBarrierPtr *)
                           &(((JavascriptNativeArray *)ints_local)->super_JavascriptArray).head);
      pSVar5 = SparseArraySegment<double>::From(*ppSVar7);
      if ((length == 0) || (length != (pSVar5->super_SparseArraySegmentBase).length)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x403,"(count > 0 && count == head->length)",
                                    "count > 0 && count == head->length");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      for (arr._4_4_ = 0; arr._4_4_ < length; arr._4_4_ = arr._4_4_ + 1) {
        *(double *)(&pSVar5[1].super_SparseArraySegmentBase.left + (ulong)arr._4_4_ * 2) =
             (double)(int)ints[(ulong)arr._4_4_ + 1].count;
      }
      JavascriptNativeArray::SetArrayProfileInfo
                ((JavascriptNativeArray *)ints_local,
                 (RecyclerWeakReference<Js::FunctionBody> *)reentrancylock._24_8_,arrayInfo);
    }
    else {
      pJVar6 = ScriptContext::GetLibrary(scriptContext);
      ints_local = (AuxArray<int> *)JavascriptLibrary::CreateArrayLiteral(pJVar6,length);
      ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                          ((WriteBarrierPtr *)&((JavascriptArray *)ints_local)->head);
      pSVar8 = SparseArraySegment<void_*>::From(*ppSVar7);
      if ((length == 0) || (length != (pSVar8->super_SparseArraySegmentBase).length)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x40f,"(count > 0 && count == head->length)",
                                    "count > 0 && count == head->length");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      for (local_d4 = 0; local_d4 < length; local_d4 = local_d4 + 1) {
        nValue = ints[(ulong)local_d4 + 1].count;
        bVar2 = TaggedInt::IsOverflow(nValue);
        if (bVar2) {
          local_10 = JavascriptNumber::NewInlined((double)(int)nValue,scriptContext);
        }
        else {
          local_10 = TaggedInt::ToVarUnchecked(nValue);
        }
        Memory::WriteBarrierPtr<void>::operator=
                  ((WriteBarrierPtr<void> *)
                   (&pSVar8[1].super_SparseArraySegmentBase.left + (ulong)local_d4 * 2),local_10);
      }
    }
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_68);
  return ints_local;
}

Assistant:

Var JavascriptArray::ProfiledNewScIntArray(AuxArray<int32> *ints, ScriptContext* scriptContext, ArrayCallSiteInfo *arrayInfo, RecyclerWeakReference<FunctionBody> *weakFuncRef)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrArr_ProfiledNewScIntArray, reentrancylock, scriptContext->GetThreadContext());
        // Called only to create array literals: size is known.
        uint32 count = ints->count;

        if (arrayInfo->IsNativeIntArray())
        {
            JavascriptNativeIntArray *arr;

#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary *lib = scriptContext->GetLibrary();
            FunctionBody *functionBody = weakFuncRef->Get();

            if (JavascriptLibrary::IsCopyOnAccessArrayCallSite(lib, arrayInfo, count))
            {
                Assert(lib->cacheForCopyOnAccessArraySegments);
                arr = scriptContext->GetLibrary()->CreateCopyOnAccessNativeIntArrayLiteral(arrayInfo, functionBody, ints);
            }
            else
#endif
            {
                arr = scriptContext->GetLibrary()->CreateNativeIntArrayLiteral(count);
                SparseArraySegment<int32> *head = SparseArraySegment<int32>::From(arr->head);
                Assert(count > 0 && count == head->length);
                CopyArray(head->elements, head->length, ints->elements, count);
            }

            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);

            return arr;
        }

        if (arrayInfo->IsNativeFloatArray())
        {
            JavascriptNativeFloatArray *arr = scriptContext->GetLibrary()->CreateNativeFloatArrayLiteral(count);
            SparseArraySegment<double> *head = SparseArraySegment<double>::From(arr->head);
            Assert(count > 0 && count == head->length);
            for (uint i = 0; i < count; i++)
            {
                head->elements[i] = (double)ints->elements[i];
            }
            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);

            return arr;
        }

        JavascriptArray *arr = scriptContext->GetLibrary()->CreateArrayLiteral(count);
        SparseArraySegment<Var> *head = SparseArraySegment<Var>::From(arr->head);
        Assert(count > 0 && count == head->length);

        for (uint i = 0; i < count; i++)
        {
            head->elements[i] = JavascriptNumber::ToVar(ints->elements[i], scriptContext);
        }

        return arr;
        JIT_HELPER_END(ScrArr_ProfiledNewScIntArray);
    }